

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O3

int64_t av1_model_rd_for_sb_uv
                  (AV1_COMP *cpi,BLOCK_SIZE plane_bsize,MACROBLOCK *x,MACROBLOCKD *xd,
                  RD_STATS *this_rdc,int start_plane,int stop_plane)

{
  byte bVar1;
  short sVar2;
  RD_STATS *pRVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  buf_2d *pbVar11;
  int rate;
  int64_t dist;
  uint sse;
  int local_84;
  RD_STATS *local_80;
  long local_78;
  uint local_70;
  uint local_6c;
  MACROBLOCK *local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  AV1_COMP *local_48;
  uint8_t *local_40;
  long local_38;
  
  this_rdc->rate = 0;
  this_rdc->dist = 0;
  this_rdc->skip_txfm = '\0';
  iVar5 = 0;
  local_80 = this_rdc;
  if (stop_plane < start_plane) {
    lVar10 = 0;
    lVar6 = 0;
  }
  else {
    local_58 = (ulong)plane_bsize;
    pbVar11 = &x->plane[start_plane].src;
    piVar7 = &xd->plane[start_plane].dst.stride;
    local_40 = x->color_sensitivity_sb_alt + (long)start_plane + 1;
    uVar8 = (ulong)((stop_plane - start_plane) + 1);
    local_60 = local_58 * 0x70;
    lVar9 = 0;
    lVar6 = 0;
    lVar10 = 0;
    local_68 = x;
    local_50 = uVar8;
    local_48 = cpi;
    do {
      if (local_40[lVar9] != '\0') {
        local_70 = (uint)(*(int16_t **)((long)(pbVar11 + 2) + 0x10))[1];
        sVar2 = **(int16_t **)((long)(pbVar11 + 2) + 0x10);
        uVar4 = (**(code **)((long)&local_48->ppi->fn_ptr[0].vf + local_60))
                          (pbVar11->buf,pbVar11->stride,((buf_2d *)(piVar7 + -6))->buf,*piVar7,
                           &local_6c);
        local_38 = lVar10 + (ulong)local_6c;
        bVar1 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[local_58];
        av1_model_rd_from_var_lapndz
                  ((ulong)(local_6c - uVar4),(uint)bVar1,(uint)(int)sVar2 >> 3,&local_84,&local_78);
        lVar10 = local_38;
        pRVar3 = local_80;
        local_80->rate = local_80->rate + (local_84 >> 1);
        local_80->dist = local_80->dist + local_78 * 8;
        av1_model_rd_from_var_lapndz((ulong)uVar4,(uint)bVar1,local_70 >> 3,&local_84,&local_78);
        iVar5 = pRVar3->rate + local_84;
        pRVar3->rate = iVar5;
        lVar6 = local_78 * 0x10 + pRVar3->dist;
        pRVar3->dist = lVar6;
        uVar8 = local_50;
      }
      pbVar11 = (buf_2d *)((long)(pbVar11 + 4) + 8);
      piVar7 = piVar7 + 0x28c;
      lVar9 = lVar9 + 1;
    } while ((int)uVar8 != (int)lVar9);
    lVar6 = lVar6 << 7;
    x = local_68;
    if (iVar5 != 0) goto LAB_00221ab4;
  }
  local_80->skip_txfm = '\x01';
  iVar5 = 0;
LAB_00221ab4:
  if (lVar10 * 0x800 <= ((long)x->rdmult * (long)iVar5 + 0x100 >> 9) + lVar6) {
    local_80->rate = 0;
    local_80->dist = lVar10 << 4;
    local_80->skip_txfm = '\x01';
  }
  return lVar10;
}

Assistant:

int64_t av1_model_rd_for_sb_uv(AV1_COMP *cpi, BLOCK_SIZE plane_bsize,
                               MACROBLOCK *x, MACROBLOCKD *xd,
                               RD_STATS *this_rdc, int start_plane,
                               int stop_plane) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  unsigned int sse;
  int rate;
  int64_t dist;
  int plane;
  int64_t tot_sse = 0;

  this_rdc->rate = 0;
  this_rdc->dist = 0;
  this_rdc->skip_txfm = 0;

  for (plane = start_plane; plane <= stop_plane; ++plane) {
    struct macroblock_plane *const p = &x->plane[plane];
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const uint32_t dc_quant = p->dequant_QTX[0];
    const uint32_t ac_quant = p->dequant_QTX[1];
    const BLOCK_SIZE bs = plane_bsize;
    unsigned int var;
    if (!x->color_sensitivity[COLOR_SENS_IDX(plane)]) continue;

    var = cpi->ppi->fn_ptr[bs].vf(p->src.buf, p->src.stride, pd->dst.buf,
                                  pd->dst.stride, &sse);
    assert(sse >= var);
    tot_sse += sse;

    av1_model_rd_from_var_lapndz(sse - var, num_pels_log2_lookup[bs],
                                 dc_quant >> 3, &rate, &dist);

    this_rdc->rate += rate >> 1;
    this_rdc->dist += dist << 3;

    av1_model_rd_from_var_lapndz(var, num_pels_log2_lookup[bs], ac_quant >> 3,
                                 &rate, &dist);

    this_rdc->rate += rate;
    this_rdc->dist += dist << 4;
  }

  if (this_rdc->rate == 0) {
    this_rdc->skip_txfm = 1;
  }

  if (RDCOST(x->rdmult, this_rdc->rate, this_rdc->dist) >=
      RDCOST(x->rdmult, 0, tot_sse << 4)) {
    this_rdc->rate = 0;
    this_rdc->dist = tot_sse << 4;
    this_rdc->skip_txfm = 1;
  }

  return tot_sse;
}